

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglThreadCleanUpTests.cpp
# Opt level: O2

TestCaseGroup * deqp::egl::createThreadCleanUpTest(EglTestContext *eglTestCtx)

{
  TestCaseGroup *pTVar1;
  ThreadCleanUpTest *pTVar2;
  MovePtr<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_> group;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar1,eglTestCtx,"thread_cleanup","Thread cleanup tests");
  group.super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>.
  m_data.ptr = pTVar1;
  pTVar2 = (ThreadCleanUpTest *)operator_new(0xb0);
  anon_unknown_0::ThreadCleanUpTest::ThreadCleanUpTest
            (pTVar2,eglTestCtx,CONTEXTTYPE_SINGLE,SURFACETYPE_SINGLE);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pTVar2);
  pTVar1 = group.
           super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
           .m_data.ptr;
  pTVar2 = (ThreadCleanUpTest *)operator_new(0xb0);
  anon_unknown_0::ThreadCleanUpTest::ThreadCleanUpTest
            (pTVar2,eglTestCtx,CONTEXTTYPE_MULTI,SURFACETYPE_SINGLE);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pTVar2);
  pTVar1 = group.
           super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
           .m_data.ptr;
  pTVar2 = (ThreadCleanUpTest *)operator_new(0xb0);
  anon_unknown_0::ThreadCleanUpTest::ThreadCleanUpTest
            (pTVar2,eglTestCtx,CONTEXTTYPE_SINGLE,SURFACETYPE_MULTI);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pTVar2);
  pTVar1 = group.
           super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
           .m_data.ptr;
  pTVar2 = (ThreadCleanUpTest *)operator_new(0xb0);
  anon_unknown_0::ThreadCleanUpTest::ThreadCleanUpTest
            (pTVar2,eglTestCtx,CONTEXTTYPE_MULTI,SURFACETYPE_MULTI);
  tcu::TestNode::addChild((TestNode *)pTVar1,(TestNode *)pTVar2);
  pTVar1 = group.
           super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
           .m_data.ptr;
  group.super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  de::details::UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>::
  ~UniqueBase(&group.
               super_UniqueBase<deqp::egl::TestCaseGroup,_de::DefaultDeleter<deqp::egl::TestCaseGroup>_>
             );
  return pTVar1;
}

Assistant:

TestCaseGroup* createThreadCleanUpTest (EglTestContext& eglTestCtx)
{
	de::MovePtr<TestCaseGroup> group (new TestCaseGroup(eglTestCtx, "thread_cleanup", "Thread cleanup tests"));

	group->addChild(new ThreadCleanUpTest(eglTestCtx, ThreadCleanUpTest::CONTEXTTYPE_SINGLE,	ThreadCleanUpTest::SURFACETYPE_SINGLE));
	group->addChild(new ThreadCleanUpTest(eglTestCtx, ThreadCleanUpTest::CONTEXTTYPE_MULTI,		ThreadCleanUpTest::SURFACETYPE_SINGLE));

	group->addChild(new ThreadCleanUpTest(eglTestCtx, ThreadCleanUpTest::CONTEXTTYPE_SINGLE,	ThreadCleanUpTest::SURFACETYPE_MULTI));
	group->addChild(new ThreadCleanUpTest(eglTestCtx, ThreadCleanUpTest::CONTEXTTYPE_MULTI,		ThreadCleanUpTest::SURFACETYPE_MULTI));

	return group.release();
}